

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * off_bit_name(long *off_flags)

{
  ulong uVar1;
  char *pcVar2;
  ulong *in_RDI;
  __type_conflict2 _Var3;
  
  off_bit_name::buf[0] = '\0';
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffb25);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," area_attack");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffb70);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," backstab");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffbb8);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," bash");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffc03);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," berserk");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffc4e);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," disarm");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffc99);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," dodge");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffce4);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," fade");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffd2f);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," fast");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffd77);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," kick");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffdbc);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," kick_dirt");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffe01);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," parry");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffe46);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," tail");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffe8b);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," trip");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ffed0);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," crush");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fff15);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_all");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fff5a);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_align");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fff9f);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_race");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fffe4);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_players");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x600029);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_guard");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x60006e);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_vnum");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x6000b3);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," no_track");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x6000f8);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," static_track");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x60013d);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," spam_murder");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x600181);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(off_bit_name::buf," assist_group");
  }
  pcVar2 = " none";
  if (off_bit_name::buf[0] != '\0') {
    pcVar2 = off_bit_name::buf;
  }
  return pcVar2 + 1;
}

Assistant:

char *off_bit_name(long off_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(off_flags, OFF_AREA_ATTACK))
		strcat(buf, " area_attack");

	if (IS_SET(off_flags, OFF_BACKSTAB))
		strcat(buf, " backstab");

	if (IS_SET(off_flags, OFF_BASH))
		strcat(buf, " bash");

	if (IS_SET(off_flags, OFF_BERSERK))
		strcat(buf, " berserk");

	if (IS_SET(off_flags, OFF_DISARM))
		strcat(buf, " disarm");

	if (IS_SET(off_flags, OFF_DODGE))
		strcat(buf, " dodge");

	if (IS_SET(off_flags, OFF_FADE))
		strcat(buf, " fade");

	if (IS_SET(off_flags, OFF_FAST))
		strcat(buf, " fast");

	if (IS_SET(off_flags, OFF_KICK))
		strcat(buf, " kick");

	if (IS_SET(off_flags, OFF_KICK_DIRT))
		strcat(buf, " kick_dirt");

	if (IS_SET(off_flags, OFF_PARRY))
		strcat(buf, " parry");

	if (IS_SET(off_flags, OFF_TAIL))
		strcat(buf, " tail");

	if (IS_SET(off_flags, OFF_TRIP))
		strcat(buf, " trip");

	if (IS_SET(off_flags, OFF_CRUSH))
		strcat(buf, " crush");

	if (IS_SET(off_flags, ASSIST_ALL))
		strcat(buf, " assist_all");

	if (IS_SET(off_flags, ASSIST_ALIGN))
		strcat(buf, " assist_align");

	if (IS_SET(off_flags, ASSIST_RACE))
		strcat(buf, " assist_race");

	if (IS_SET(off_flags, ASSIST_PLAYERS))
		strcat(buf, " assist_players");

	if (IS_SET(off_flags, ASSIST_GUARD))
		strcat(buf, " assist_guard");

	if (IS_SET(off_flags, ASSIST_VNUM))
		strcat(buf, " assist_vnum");

	if (IS_SET(off_flags, NO_TRACK))
		strcat(buf, " no_track");

	if (IS_SET(off_flags, STATIC_TRACKING))
		strcat(buf, " static_track");

	if (IS_SET(off_flags, SPAM_MURDER))
		strcat(buf, " spam_murder");

	if (IS_SET(off_flags, ASSIST_GROUP))
		strcat(buf, " assist_group");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}